

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QByteArray * __thiscall
QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char>::convertTo<QByteArray>
          (QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  DataPointer *this_00;
  QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char> *in_RDI;
  long in_FS_OFFSET;
  iterator start;
  qsizetype len;
  QByteArray *s;
  iterator d;
  char **in_stack_ffffffffffffffa8;
  QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char> *p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI;
  bVar2 = isNull(in_RDI);
  if (bVar2) {
    QByteArray::QByteArray((QByteArray *)0x1574fc);
  }
  else {
    qVar3 = QConcatenable<QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char>_>::size(p);
    *(undefined1 **)&p->a = &DAT_aaaaaaaaaaaaaaaa;
    (p->a).b = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&p->b = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)p,qVar3,Uninitialized);
    this_00 = QByteArray::data_ptr((QByteArray *)p);
    QArrayDataPointer<char>::data(this_00);
    QConcatenable<QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char>_>::appendTo<char>
              (p,in_stack_ffffffffffffffa8);
    if (qVar3 != 0) {
      QByteArray::resize((longlong)p);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }